

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void kratos::generate_verilog_pkg(Generator *top,SystemVerilogCodeGenOptions *options)

{
  Generator *generator;
  __type_conflict2 _Var1;
  bool bVar2;
  _Ios_Openmode _Var3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
  *this;
  reference __in;
  type *__args;
  reference __in_00;
  type *__lhs;
  Context *this_00;
  __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar4;
  streambuf *psVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar6 [16];
  format_args args;
  string_view format_str;
  undefined1 local_1168 [8];
  ofstream out;
  undefined1 local_f68 [8];
  __string_type content_1;
  stringstream content_stream_1;
  ifstream in_1;
  undefined1 local_bb8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> def_str;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  values;
  shared_ptr<kratos::Generator> *gen;
  iterator __end2;
  iterator __begin2;
  set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *__range2;
  set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  gens;
  ofstream out_1;
  int local_8fc;
  undefined1 local_8f8 [8];
  string content;
  stringstream content_stream;
  ifstream in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  undefined1 local_528 [8];
  string path;
  type *src;
  type *module_name_1;
  _Self local_4f0;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  string local_4c8;
  SystemVerilogCodeGenOptions local_4a8;
  undefined1 local_450 [8];
  SystemVerilogCodeGen codegen;
  type *module_gen;
  type *module_name;
  _Self local_1b0;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result;
  string header_filename;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
  *generator_map;
  UniqueGeneratorVisitor unique_visitor;
  string local_b8;
  SystemVerilogCodeGenOptions *local_98;
  SystemVerilogCodeGenOptions *options_local;
  Generator *top_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_98 = options;
  options_local = (SystemVerilogCodeGenOptions *)top;
  _Var1 = std::operator==(&options->package_name,&top->name);
  if (_Var1) {
    unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
    auVar6 = __cxa_allocate_exception(0x10);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&options_local[1].package_name.field_2 + 8);
    local_38 = &local_b8;
    local_40 = "Package name cannot be the same as module name ({0}";
    local_68.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string&,char[52],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"Package name cannot be the same as module name ({0}",(v7 *)vargs,
                    auVar6._8_8_,
                    (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                    "Package name cannot be the same as module name ({0}");
    local_50 = &local_68;
    local_78 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&top_local;
    local_30 = local_50;
    local_20 = local_50;
    local_10 = local_50;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_50->string);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_80.values_;
    format_str.size_ = (size_t)top_local;
    format_str.data_ = (char *)local_78.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)local_78.data_,format_str,args);
    UserException::UserException(auVar6._0_8_,&local_b8);
    unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
    __cxa_throw(auVar6._0_8_,&UserException::typeinfo,UserException::~UserException);
  }
  UniqueGeneratorVisitor::UniqueGeneratorVisitor((UniqueGeneratorVisitor *)&generator_map);
  IRVisitor::visit_generator_root_p((IRVisitor *)&generator_map,(Generator *)options_local);
  this = UniqueGeneratorVisitor::generator_map_abi_cxx11_((UniqueGeneratorVisitor *)&generator_map);
  track_generators((Generator *)options_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &result._M_t._M_impl.super__Rb_tree_header._M_node_count,&options->package_name,
                 ".svh");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&__range1);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
           ::begin(this);
  local_1b0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
       ::end(this);
  while (bVar2 = std::operator!=(&__end1,&local_1b0), bVar2) {
    __in = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>
           ::operator*(&__end1);
    __args = std::get<0ul,std::__cxx11::string_const,kratos::Generator*>(__in);
    codegen.stream_._408_8_ = std::get<1ul,std::__cxx11::string_const,kratos::Generator*>(__in);
    generator = *(Generator **)codegen.stream_._408_8_;
    SystemVerilogCodeGenOptions::SystemVerilogCodeGenOptions(&local_4a8,options);
    SystemVerilogCodeGen::SystemVerilogCodeGen
              ((SystemVerilogCodeGen *)local_450,generator,&local_4a8);
    SystemVerilogCodeGenOptions::~SystemVerilogCodeGenOptions(&local_4a8);
    SystemVerilogCodeGen::str_abi_cxx11_(&local_4c8,(SystemVerilogCodeGen *)local_450);
    std::
    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<std::__cxx11::string_const&,std::__cxx11::string>
              ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&__range1,__args,&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    SystemVerilogCodeGen::~SystemVerilogCodeGen((SystemVerilogCodeGen *)local_450);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&__range1);
  local_4f0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__range1);
  while (bVar2 = std::operator!=(&__end1_1,&local_4f0), bVar2) {
    __in_00 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator*(&__end1_1);
    __lhs = std::get<0ul,std::__cxx11::string_const,std::__cxx11::string>(__in_00);
    path.field_2._8_8_ = std::get<1ul,std::__cxx11::string_const,std::__cxx11::string>(__in_00);
    std::operator+(&local_548,__lhs,".sv");
    fs::join((string *)local_528,&options->output_dir,&local_548);
    std::__cxx11::string::~string((string *)&local_548);
    bVar2 = fs::exists((string *)local_528);
    if (bVar2) {
      std::ifstream::ifstream(&content_stream.field_0x180,(string *)local_528,_S_in);
      std::__cxx11::stringstream::stringstream((stringstream *)(content.field_2._M_local_buf + 8));
      psVar5 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(&content_stream.field_0x8,psVar5);
      std::__cxx11::stringstream::str();
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_8f8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              path.field_2._8_8_);
      if (_Var1) {
        local_8fc = 5;
      }
      else {
        local_8fc = 0;
      }
      std::__cxx11::string::~string((string *)local_8f8);
      std::__cxx11::stringstream::~stringstream((stringstream *)(content.field_2._M_local_buf + 8));
      std::ifstream::~ifstream(&content_stream.field_0x180);
      if (local_8fc == 0) goto LAB_00399b25;
    }
    else {
LAB_00399b25:
      std::ofstream::ofstream
                (&gens._M_t._M_impl.super__Rb_tree_header._M_node_count,(string *)local_528,_S_trunc
                );
      std::operator<<((ostream *)&gens._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (string *)path.field_2._8_8_);
      this_00 = Generator::context((Generator *)options_local);
      Context::get_generators_by_name
                ((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  *)&__range2,this_00,__lhs);
      __end2 = std::
               set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               ::begin((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                        *)&__range2);
      gen = (shared_ptr<kratos::Generator> *)
            std::
            set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
            ::end((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   *)&__range2);
      while (bVar2 = std::operator!=(&__end2,(_Self *)&gen), bVar2) {
        this_01 = (__shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Generator>_>::operator*
                               (&__end2);
        peVar4 = std::
                 __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_01);
        if ((peVar4->debug & 1U) != 0) {
          peVar4 = std::
                   __shared_ptr_access<kratos::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(this_01);
          std::__cxx11::string::operator=((string *)&peVar4->verilog_fn,(string *)local_528);
        }
        std::_Rb_tree_const_iterator<std::shared_ptr<kratos::Generator>_>::operator++(&__end2);
      }
      std::
      set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ::~set((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
              *)&__range2);
      std::ofstream::~ofstream(&gens._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    std::__cxx11::string::~string((string *)local_528);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1_1);
  }
  if ((options->extract_debug_info & 1U) != 0) {
    output_pkg_debug_info(this,options);
  }
  fs::join((string *)&values.second,&options->output_dir,
           (string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::operator=
            ((string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)&values.second);
  std::__cxx11::string::~string((string *)&values.second);
  generate_sv_package_header
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)((long)&def_str.field_2 + 8),(Generator *)options_local,&options->package_name,true)
  ;
  std::__cxx11::string::string((string *)local_bb8,(string *)(def_str.field_2._M_local_buf + 8));
  bVar2 = fs::exists((string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar2) {
    std::ifstream::ifstream
              (&content_stream_1.field_0x180,
               (string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,_S_in);
    std::__cxx11::stringstream::stringstream((stringstream *)(content_1.field_2._M_local_buf + 8));
    psVar5 = (streambuf *)std::ifstream::rdbuf();
    std::ostream::operator<<(&content_stream_1.field_0x8,psVar5);
    std::__cxx11::stringstream::str();
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_f68,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_bb8);
    std::__cxx11::string::~string((string *)local_f68);
    std::__cxx11::stringstream::~stringstream((stringstream *)(content_1.field_2._M_local_buf + 8));
    std::ifstream::~ifstream(&content_stream_1.field_0x180);
    if (_Var1) goto LAB_00399f62;
  }
  _Var3 = std::operator|(_S_in,_S_out);
  _Var3 = std::operator|(_Var3,_S_trunc);
  std::ofstream::ofstream
            (local_1168,(string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,_Var3);
  std::operator<<((ostream *)local_1168,(string *)local_bb8);
  std::ofstream::~ofstream(local_1168);
LAB_00399f62:
  std::__cxx11::string::~string((string *)local_bb8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *)((long)&def_str.field_2 + 8));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&__range1);
  std::__cxx11::string::~string((string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count);
  UniqueGeneratorVisitor::~UniqueGeneratorVisitor((UniqueGeneratorVisitor *)&generator_map);
  return;
}

Assistant:

void generate_verilog_pkg(Generator* top, SystemVerilogCodeGenOptions options) {
    // input check
    if (options.package_name == top->name) {
        throw UserException(
            ::format("Package name cannot be the same as module name ({0}", top->name));
    }
    // this pass assumes that all the generators has been uniquified
    // first get all the unique generators
    UniqueGeneratorVisitor unique_visitor;
    // this can be parallelized
    unique_visitor.visit_generator_root_p(top);
    auto const& generator_map = unique_visitor.generator_map();
    track_generators(top);

    // we use header_name + ".svh"
    std::string header_filename = options.package_name + ".svh";
    std::map<std::string, std::string> result;
    for (const auto& [module_name, module_gen] : generator_map) {
        SystemVerilogCodeGen codegen(module_gen, options);
        result.emplace(module_name, codegen.str());
    }
    // write out the content to the output_dir
    // we assume output_dir already exists
    // notice that if the content is the same, we don't override to avoid modifying the timestamps
    // this will help with incremental compile in the downstream tools, typically the commercial
    // ones
    // unfortunately verilator doesn't support incremental build. see
    // https://www.veripool.org/boards/2/topics/2822
    for (auto const& [module_name, src] : result) {
        auto path = kratos::fs::join(options.output_dir, module_name + ".sv");
        if (kratos::fs::exists(path)) {
            // load up the file
            std::ifstream in(path);
            std::stringstream content_stream;
            content_stream << in.rdbuf();
            std::string content = content_stream.str();
            if (content == src) continue;
        }
        // truncate mode
        std::ofstream out(path, std::ios::trunc);
        out << src;
        // tell the system where it went, if allowed
        auto gens = top->context()->get_generators_by_name(module_name);
        for (auto const& gen : gens) {
            if (gen->debug) gen->verilog_fn = path;
        }
    }
    // output debug info as well, if required
    if (options.extract_debug_info) {
        output_pkg_debug_info(generator_map, options);
    }

    header_filename = kratos::fs::join(options.output_dir, header_filename);

    // compare it with the old one, if exists. this is for incremental build
    auto values = generate_sv_package_header(top, options.package_name, true);
    auto def_str = values.first;
    if (kratos::fs::exists(header_filename)) {
        std::ifstream in(header_filename);
        std::stringstream content_stream;
        content_stream << in.rdbuf();
        auto content = content_stream.str();
        if (content == def_str) {
            return;
        }
    }
    std::ofstream out(header_filename, std::ios::in | std::ios::out | std::ios::trunc);
    out << def_str;
}